

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_compress_fast_extState_fastReset
              (void *state,char *src,char *dst,int srcSize,int dstCapacity,int acceleration)

{
  short sVar1;
  ushort uVar2;
  short sVar3;
  char cVar4;
  int iVar5;
  BYTE *s;
  ulong uVar6;
  long *plVar7;
  long *plVar8;
  long lVar9;
  int *piVar10;
  ulong uVar11;
  char *pcVar12;
  int iVar13;
  int *piVar14;
  long *plVar15;
  int *piVar16;
  short *psVar17;
  char *pcVar18;
  ulong *puVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  ulong *puVar25;
  ulong *puVar26;
  BYTE *e_4;
  long lVar27;
  char *pcVar28;
  uint uVar29;
  BYTE *e;
  short *psVar30;
  long *plVar31;
  long *plVar32;
  int *piVar33;
  undefined4 in_register_00000084;
  ulong uVar34;
  ulong *puVar35;
  ulong uVar36;
  char cVar37;
  int iVar38;
  long lVar39;
  BYTE *e_1;
  int *piVar40;
  uint uVar41;
  char *unaff_R13;
  char *pcVar42;
  uint uVar43;
  BYTE *s_4;
  ulong uVar44;
  BYTE *d;
  short *psVar45;
  ulong uVar46;
  bool bVar47;
  bool bVar48;
  U16 *hashTable;
  short *local_c0;
  long *local_b8;
  
  piVar14 = (int *)CONCAT44(in_register_00000084,dstCapacity);
  iVar38 = 1;
  if (1 < acceleration) {
    iVar38 = acceleration;
  }
  iVar13 = 0;
  if ((uint)srcSize < 0x7e000001) {
    iVar13 = (uint)((ulong)(uint)srcSize * 0x8080808081 >> 0x27) + 0x10;
  }
  sVar1 = *(short *)((long)state + 0x4004);
  sVar3 = (short)src;
  iVar5 = (int)dst;
  if (dstCapacity < iVar13) {
    local_b8 = (long *)src;
    if (srcSize < 0x1000b) {
      if (sVar1 == 0) {
        if ((*(short *)((long)state + 0x4006) != 0) &&
           (((*(short *)((long)state + 0x4006) != 3 || (0xfff < srcSize)) ||
            (0xfffe < (uint)(*(int *)((long)state + 0x4000) + srcSize))))) {
          *(undefined2 *)((long)state + 0x4006) = 0;
          memset(state,0,0x4004);
        }
        *(undefined8 *)((long)state + 0x4008) = 0;
        *(undefined8 *)((long)state + 0x4010) = 0;
        *(undefined4 *)((long)state + 0x4018) = 0;
      }
      else {
        memset(state,0,0x4020);
      }
      uVar43 = *(uint *)((long)state + 0x4000);
      local_c0 = (short *)dst;
      if ((ulong)uVar43 == 0) {
        if (0x7e000000 < (uint)srcSize) {
          return 0;
        }
        *(int *)((long)state + 0x4018) = *(int *)((long)state + 0x4018) + srcSize;
        pcVar42 = dst + dstCapacity;
        *(int *)((long)state + 0x4000) = srcSize;
        *(undefined2 *)((long)state + 0x4006) = 3;
        piVar14 = (int *)src;
        if (0xc < srcSize) {
          *(undefined2 *)((long)state + (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2) = 0;
          piVar40 = (int *)(src + 1);
          uVar43 = (uint)(*(int *)(src + 1) * -0x61c8864f) >> 0x13;
          do {
            iVar22 = 1;
            piVar16 = piVar40;
            iVar13 = iVar38 << 6;
            do {
              piVar40 = piVar16;
              piVar16 = (int *)((long)iVar22 + (long)piVar40);
              if (src + (long)srcSize + -0xb < piVar16) {
                iVar21 = 2;
              }
              else {
                uVar2 = *(ushort *)((long)state + (ulong)uVar43 * 2);
                iVar22 = *piVar16;
                *(short *)((long)state + (ulong)uVar43 * 2) = (short)piVar40 - sVar3;
                iVar21 = 7;
                if (*(int *)(src + uVar2) != *piVar40) {
                  iVar21 = 0;
                }
                unaff_R13 = src + uVar2;
                uVar43 = (uint)(iVar22 * -0x61c8864f) >> 0x13;
              }
              iVar22 = iVar13 >> 6;
              iVar13 = iVar13 + 1;
            } while (iVar21 == 0);
            if (iVar21 == 7) {
              iVar21 = 0;
            }
            psVar45 = local_c0;
            if (iVar21 == 0) {
              uVar24 = (int)piVar40 - (int)piVar14;
              lVar27 = 0;
              cVar4 = (char)piVar40 * '\x10' + (char)piVar14 * -0x10;
              uVar29 = uVar24 - 0xf;
              do {
                uVar23 = uVar29;
                cVar37 = cVar4;
                lVar9 = lVar27;
                pcVar28 = unaff_R13 + lVar9;
                piVar16 = (int *)((long)piVar40 + lVar9);
                if ((pcVar28 <= src) || (piVar16 <= piVar14)) break;
                lVar27 = lVar9 + -1;
                cVar4 = cVar37 + -0x10;
                uVar29 = uVar23 - 1;
              } while (*(char *)((long)piVar40 + lVar9 + -1) == unaff_R13[lVar9 + -1]);
              iVar13 = (int)lVar9;
              uVar44 = (ulong)(uint)(iVar13 + ((int)piVar40 - (int)piVar14));
              psVar45 = (short *)((long)local_c0 + 1);
              pcVar18 = (char *)((long)local_c0 +
                                ((ulong)uVar24 + lVar9 & 0xffffffff) / 0xff + uVar44 + 9);
              if (pcVar42 < pcVar18) {
                iVar21 = 1;
              }
              else {
                if ((uint)((ulong)uVar24 + lVar9) < 0xf) {
                  *(char *)local_c0 = cVar37;
                  psVar30 = psVar45;
                }
                else {
                  uVar11 = (ulong)(uVar24 - 0xf) + lVar9;
                  *(char *)local_c0 = -0x10;
                  if (0xfe < (int)uVar11) {
                    if (0x1fc < (int)uVar23) {
                      uVar23 = 0x1fd;
                    }
                    uVar29 = (uVar24 - uVar23) + iVar13 + 0xef;
                    uVar11 = (ulong)uVar29 / 0xff;
                    memset(psVar45,0xff,(ulong)(uVar29 / 0xff + 1));
                    psVar45 = (short *)((long)local_c0 + uVar11 + 2);
                    uVar11 = (ulong)((uVar24 - 0x10e) + iVar13 + (int)uVar11 * -0xff);
                  }
                  *(char *)psVar45 = (char)uVar11;
                  psVar30 = (short *)((long)psVar45 + 1);
                }
                psVar45 = (short *)(uVar44 + (long)psVar30);
                piVar40 = piVar14;
                do {
                  *(undefined8 *)psVar30 = *(undefined8 *)piVar40;
                  psVar30 = psVar30 + 4;
                  piVar40 = piVar40 + 2;
                } while (psVar30 < psVar45);
                iVar21 = 0;
              }
              piVar40 = piVar16;
              unaff_R13 = pcVar28;
              if (pcVar18 <= pcVar42) {
                do {
                  *psVar45 = (short)piVar16 - (short)pcVar28;
                  puVar25 = (ulong *)(piVar16 + 1);
                  puVar26 = (ulong *)(pcVar28 + 4);
                  puVar19 = puVar25;
                  piVar40 = piVar14;
                  if (puVar25 < src + (long)srcSize + -0xc) {
                    uVar11 = *(ulong *)(piVar16 + 1) ^ *(ulong *)(pcVar28 + 4);
                    uVar44 = 0;
                    if (uVar11 != 0) {
                      for (; (uVar11 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                      }
                    }
                    piVar40 = (int *)(uVar44 >> 3 & 0x1fffffff);
                    uVar29 = (uint)piVar40;
                    puVar19 = (ulong *)(piVar16 + 3);
                    puVar26 = (ulong *)(pcVar28 + 0xc);
                    if (*(ulong *)(pcVar28 + 4) == *(ulong *)(piVar16 + 1)) goto LAB_0010f43b;
                  }
                  else {
LAB_0010f43b:
                    do {
                      if (src + (long)srcSize + -0xc <= puVar19) {
                        if ((puVar19 < src + (long)srcSize + -8) && ((int)*puVar26 == (int)*puVar19)
                           ) {
                          puVar19 = (ulong *)((long)puVar19 + 4);
                          puVar26 = (ulong *)((long)puVar26 + 4);
                        }
                        if ((puVar19 < src + (long)srcSize + -6) &&
                           ((short)*puVar26 == (short)*puVar19)) {
                          puVar19 = (ulong *)((long)puVar19 + 2);
                          puVar26 = (ulong *)((long)puVar26 + 2);
                        }
                        if (puVar19 < src + (long)srcSize + -5) {
                          puVar19 = (ulong *)((long)puVar19 +
                                             (ulong)((char)*puVar26 == (char)*puVar19));
                        }
                        uVar29 = (int)puVar19 - (int)puVar25;
                        break;
                      }
                      uVar44 = *puVar26;
                      uVar46 = *puVar19 ^ uVar44;
                      uVar11 = 0;
                      if (uVar46 != 0) {
                        for (; (uVar46 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                        }
                      }
                      puVar35 = (ulong *)((uVar11 >> 3 & 0x1fffffff) + (long)puVar19);
                      puVar26 = puVar26 + 1;
                      bVar47 = uVar44 == *puVar19;
                      puVar19 = puVar19 + 1;
                      if (!bVar47) {
                        puVar19 = puVar35;
                      }
                      piVar40 = (int *)((ulong)piVar40 & 0xffffffff);
                      if (!bVar47) {
                        piVar40 = (int *)(ulong)(uint)((int)puVar35 - (int)puVar25);
                      }
                      uVar29 = (uint)piVar40;
                    } while (bVar47);
                  }
                  psVar30 = psVar45 + 1;
                  pcVar18 = (char *)((long)psVar45 + (ulong)(uVar29 + 0xf0) / 0xff + 8);
                  if (pcVar18 <= pcVar42) {
                    if (uVar29 < 0xf) {
                      *(char *)local_c0 = (char)*local_c0 + (char)uVar29;
                    }
                    else {
                      *(char *)local_c0 = (char)*local_c0 + '\x0f';
                      uVar24 = uVar29 - 0xf;
                      psVar30[0] = -1;
                      psVar30[1] = -1;
                      if (0x3fb < uVar24) {
                        uVar23 = uVar29 - 0x40b;
                        memset(psVar45 + 3,0xff,(ulong)((uVar23 / 0x3fc) * 4 + 4));
                        uVar24 = uVar23 % 0x3fc;
                        psVar30 = (short *)((long)psVar45 + (ulong)((uVar23 / 0x3fc) * 4) + 6);
                      }
                      pcVar12 = (char *)((long)psVar30 + (ulong)uVar24 / 0xff);
                      psVar30 = (short *)(pcVar12 + 1);
                      *pcVar12 = (char)(uVar24 / 0xff) + (char)uVar24;
                    }
                  }
                  lVar27 = (long)piVar16 + (ulong)uVar29;
                  piVar16 = (int *)(lVar27 + 4);
                  piVar40 = piVar16;
                  unaff_R13 = pcVar28;
                  psVar45 = psVar30;
                  if (pcVar42 < pcVar18) {
                    iVar21 = 1;
                    goto LAB_0010f66d;
                  }
                  piVar14 = piVar16;
                  if (src + (long)srcSize + -0xb <= piVar16) {
                    iVar21 = 3;
                    goto LAB_0010f66d;
                  }
                  *(short *)((long)state +
                            (ulong)((uint)(*(int *)(lVar27 + 2) * -0x61c8864f) >> 0x13) * 2) =
                       ((short)lVar27 + 2) - sVar3;
                  uVar44 = (ulong)((uint)(*piVar16 * -0x61c8864f) >> 0x13);
                  uVar2 = *(ushort *)((long)state + uVar44 * 2);
                  *(short *)((long)state + uVar44 * 2) = (short)piVar16 - sVar3;
                  iVar13 = *(int *)(src + uVar2);
                  iVar22 = *piVar16;
                  if (iVar13 == iVar22) {
                    *(char *)psVar30 = '\0';
                    psVar45 = (short *)((long)psVar30 + 1);
                    local_c0 = psVar30;
                  }
                  pcVar28 = src + uVar2;
                } while (iVar13 == iVar22);
                piVar40 = (int *)(lVar27 + 5);
                uVar43 = (uint)(*(int *)(lVar27 + 5) * -0x61c8864f) >> 0x13;
                iVar21 = 0;
                unaff_R13 = pcVar28;
              }
            }
LAB_0010f66d:
            local_c0 = psVar45;
          } while (iVar21 == 0);
          dst = (char *)local_c0;
          if (1 < iVar21 - 2U) {
            return 0;
          }
        }
        pcVar18 = src + ((long)srcSize - (long)piVar14);
        pcVar28 = (char *)((long)dst + (long)(pcVar18 + (ulong)(pcVar18 + 0xf0) / 0xff + 1));
        if (pcVar28 <= pcVar42) {
          if (pcVar18 < (char *)0xf) {
            *dst = (char)pcVar18 << 4;
          }
          else {
            pcVar12 = pcVar18 + -0xf;
            *dst = -0x10;
            psVar45 = (short *)((long)dst + 1);
            if ((char *)0xfe < pcVar12) {
              uVar44 = (ulong)(pcVar18 + -0x10e) / 0xff;
              memset((short *)((long)dst + 1),0xff,uVar44 + 1);
              pcVar12 = pcVar18 + uVar44 * -0xff + -0x10e;
              psVar45 = (short *)((long)dst + uVar44 + 2);
            }
            dst = (char *)psVar45;
            *dst = (char)pcVar12;
          }
          memcpy((char *)((long)dst + 1),piVar14,(size_t)pcVar18);
          dst = (char *)((long)dst + (long)(pcVar18 + 1));
        }
        iVar38 = (int)dst;
        bVar47 = pcVar28 < pcVar42;
        bVar48 = pcVar28 == pcVar42;
      }
      else {
        if (0x7e000000 < (uint)srcSize) {
          return 0;
        }
        iVar13 = *(int *)((long)state + 0x4018);
        piVar14 = (int *)(src + srcSize);
        pcVar42 = dst + dstCapacity;
        *(int *)((long)state + 0x4018) = iVar13 + srcSize;
        *(uint *)((long)state + 0x4000) = uVar43 + srcSize;
        *(undefined2 *)((long)state + 0x4006) = 3;
        if (0xc < srcSize) {
          lVar27 = (long)src - (ulong)uVar43;
          uVar29 = uVar43 - iVar13;
          *(short *)((long)state + (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2) =
               (short)uVar43;
          piVar40 = (int *)(src + 1);
          uVar43 = (uint)(*(int *)(src + 1) * -0x61c8864f) >> 0x13;
          piVar16 = piVar14;
          do {
            iVar22 = 1;
            iVar13 = iVar38 << 6;
            while( true ) {
              piVar33 = (int *)((long)iVar22 + (long)piVar40);
              sVar1 = (short)lVar27;
              if (src + (long)srcSize + -0xb < piVar33) {
                iVar22 = 2;
              }
              else {
                uVar44 = (ulong)uVar43;
                uVar2 = *(ushort *)((long)state + uVar44 * 2);
                piVar16 = (int *)((ulong)uVar2 + lVar27);
                uVar43 = (uint)(*piVar33 * -0x61c8864f) >> 0x13;
                *(short *)((long)state + uVar44 * 2) = (short)piVar40 - sVar1;
                iVar22 = 8;
                if ((uVar29 <= uVar2) && (iVar22 = 7, *piVar16 != *piVar40)) {
                  iVar22 = 0;
                }
              }
              if ((iVar22 != 0) && (iVar22 != 8)) break;
              iVar22 = iVar13 >> 6;
              iVar13 = iVar13 + 1;
              piVar40 = piVar33;
            }
            if (iVar22 == 7) {
              iVar22 = 0;
            }
            psVar45 = local_c0;
            if (iVar22 == 0) {
              uVar23 = (int)piVar40 - (int)local_b8;
              lVar9 = 0;
              uVar24 = uVar23 - 0xf;
              cVar4 = (char)piVar40 * '\x10' + (char)local_b8 * -0x10;
              do {
                cVar37 = cVar4;
                uVar41 = uVar24;
                lVar39 = lVar9;
                piVar33 = (int *)((long)piVar16 + lVar39);
                piVar10 = (int *)((long)piVar40 + lVar39);
                if ((piVar33 <= src) || (piVar10 <= local_b8)) break;
                lVar9 = lVar39 + -1;
                uVar24 = uVar41 - 1;
                cVar4 = cVar37 + -0x10;
              } while (*(char *)((long)piVar40 + lVar39 + -1) ==
                       *(char *)((long)piVar16 + lVar39 + -1));
              iVar13 = (int)lVar39;
              psVar30 = (short *)(ulong)(uint)(((int)piVar40 - (int)local_b8) + iVar13);
              psVar45 = (short *)((long)local_c0 + 1);
              pcVar28 = (char *)((long)local_c0 + (long)psVar30);
              if (pcVar42 < pcVar28 + ((ulong)uVar23 + lVar39 & 0xffffffff) / 0xff + 9) {
                iVar22 = 1;
              }
              else {
                if ((uint)((ulong)uVar23 + lVar39) < 0xf) {
                  *(char *)local_c0 = cVar37;
                }
                else {
                  uVar44 = (ulong)(uVar23 - 0xf) + lVar39;
                  *(char *)local_c0 = -0x10;
                  if (0xfe < (int)uVar44) {
                    if (0x1fc < (int)uVar41) {
                      uVar41 = 0x1fd;
                    }
                    uVar24 = (uVar23 - uVar41) + iVar13 + 0xef;
                    uVar44 = (ulong)uVar24 / 0xff;
                    memset(psVar45,0xff,(ulong)(uVar24 / 0xff + 1));
                    psVar45 = (short *)((long)local_c0 + uVar44 + 2);
                    uVar44 = (ulong)((uVar23 - 0x10e) + iVar13 + (int)uVar44 * -0xff);
                  }
                  *(char *)psVar45 = (char)uVar44;
                  psVar45 = (short *)((long)psVar45 + 1);
                }
                psVar30 = (short *)((long)psVar30 + (long)psVar45);
                plVar32 = local_b8;
                do {
                  *(long *)psVar45 = *plVar32;
                  psVar45 = psVar45 + 4;
                  plVar32 = (long *)((long)plVar32 + 8);
                } while (psVar45 < psVar30);
                iVar22 = 0;
                psVar45 = psVar30;
              }
              piVar40 = piVar10;
              piVar16 = piVar33;
              if (pcVar28 + ((ulong)uVar23 + lVar39 & 0xffffffff) / 0xff + 9 <= pcVar42) {
                do {
                  *psVar45 = (short)piVar10 - (short)piVar33;
                  puVar25 = (ulong *)(piVar10 + 1);
                  puVar26 = (ulong *)(piVar33 + 1);
                  puVar19 = puVar25;
                  if (puVar25 < piVar14 + -3) {
                    uVar11 = *(ulong *)(piVar10 + 1) ^ *(ulong *)(piVar33 + 1);
                    uVar44 = 0;
                    if (uVar11 != 0) {
                      for (; (uVar11 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                      }
                    }
                    psVar30 = (short *)(uVar44 >> 3 & 0x1fffffff);
                    uVar24 = (uint)psVar30;
                    puVar19 = (ulong *)(piVar10 + 3);
                    puVar26 = (ulong *)(piVar33 + 3);
                    if (*(ulong *)(piVar33 + 1) == *(ulong *)(piVar10 + 1)) goto LAB_0010f9e7;
                  }
                  else {
LAB_0010f9e7:
                    do {
                      if (piVar14 + -3 <= puVar19) {
                        if ((puVar19 < piVar14 + -2) && ((int)*puVar26 == (int)*puVar19)) {
                          puVar19 = (ulong *)((long)puVar19 + 4);
                          puVar26 = (ulong *)((long)puVar26 + 4);
                        }
                        if ((puVar19 < (ulong *)((long)piVar14 - 6U)) &&
                           ((short)*puVar26 == (short)*puVar19)) {
                          puVar19 = (ulong *)((long)puVar19 + 2);
                          puVar26 = (ulong *)((long)puVar26 + 2);
                        }
                        if (puVar19 < src + (long)srcSize + -5) {
                          puVar19 = (ulong *)((long)puVar19 +
                                             (ulong)((char)*puVar26 == (char)*puVar19));
                        }
                        uVar24 = (int)puVar19 - (int)puVar25;
                        break;
                      }
                      uVar44 = *puVar26;
                      uVar46 = *puVar19 ^ uVar44;
                      uVar11 = 0;
                      if (uVar46 != 0) {
                        for (; (uVar46 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                        }
                      }
                      puVar35 = (ulong *)((uVar11 >> 3 & 0x1fffffff) + (long)puVar19);
                      puVar26 = puVar26 + 1;
                      bVar47 = uVar44 == *puVar19;
                      puVar19 = puVar19 + 1;
                      if (!bVar47) {
                        puVar19 = puVar35;
                      }
                      psVar30 = (short *)((ulong)psVar30 & 0xffffffff);
                      if (!bVar47) {
                        psVar30 = (short *)(ulong)(uint)((int)puVar35 - (int)puVar25);
                      }
                      uVar24 = (uint)psVar30;
                    } while (bVar47);
                  }
                  psVar17 = psVar45 + 1;
                  pcVar28 = (char *)((long)psVar45 + (ulong)(uVar24 + 0xf0) / 0xff + 8);
                  if (pcVar28 <= pcVar42) {
                    if (uVar24 < 0xf) {
                      *(char *)local_c0 = (char)*local_c0 + (char)uVar24;
                    }
                    else {
                      *(char *)local_c0 = (char)*local_c0 + '\x0f';
                      uVar23 = uVar24 - 0xf;
                      psVar17[0] = -1;
                      psVar17[1] = -1;
                      if (0x3fb < uVar23) {
                        uVar41 = uVar24 - 0x40b;
                        memset(psVar45 + 3,0xff,(ulong)((uVar41 / 0x3fc) * 4 + 4));
                        uVar23 = uVar41 % 0x3fc;
                        psVar17 = (short *)((long)psVar45 + (ulong)((uVar41 / 0x3fc) * 4) + 6);
                      }
                      pcVar18 = (char *)((long)psVar17 + (ulong)uVar23 / 0xff);
                      psVar17 = (short *)(pcVar18 + 1);
                      *pcVar18 = (char)(uVar23 / 0xff) + (char)uVar23;
                    }
                  }
                  lVar9 = (ulong)uVar24 + (long)piVar10;
                  piVar10 = (int *)(lVar9 + 4);
                  psVar30 = (short *)(ulong)uVar29;
                  piVar40 = piVar10;
                  piVar16 = piVar33;
                  psVar45 = psVar17;
                  if (pcVar42 < pcVar28) {
                    iVar22 = 1;
                    goto LAB_0010fc44;
                  }
                  local_b8 = (long *)piVar10;
                  if (src + (long)srcSize + -0xb <= piVar10) {
                    iVar22 = 3;
                    goto LAB_0010fc44;
                  }
                  *(short *)((long)state +
                            (ulong)((uint)(*(int *)(lVar9 + 2) * -0x61c8864f) >> 0x13) * 2) =
                       ((short)lVar9 + 2) - sVar1;
                  uVar44 = (ulong)((uint)(*piVar10 * -0x61c8864f) >> 0x13);
                  uVar2 = *(ushort *)((long)state + uVar44 * 2);
                  piVar33 = (int *)((ulong)uVar2 + lVar27);
                  *(short *)((long)state + uVar44 * 2) = (short)piVar10 - sVar1;
                  bVar47 = true;
                  if ((uVar29 <= uVar2) && (*piVar33 == *piVar10)) {
                    *(char *)psVar17 = '\0';
                    bVar47 = false;
                    psVar45 = (short *)((long)psVar17 + 1);
                    local_c0 = psVar17;
                  }
                } while (!bVar47);
                uVar43 = (uint)(*(int *)(lVar9 + 5) * -0x61c8864f) >> 0x13;
                iVar22 = 0;
                piVar40 = (int *)(lVar9 + 5);
                piVar16 = piVar33;
              }
            }
LAB_0010fc44:
            local_c0 = psVar45;
          } while (iVar22 == 0);
          if (1 < iVar22 - 2U) {
            return 0;
          }
        }
        uVar44 = (long)piVar14 - (long)local_b8;
        pcVar28 = (char *)((long)local_c0 + (uVar44 + 0xf0) / 0xff + uVar44 + 1);
        if (pcVar28 <= pcVar42) {
          if (uVar44 < 0xf) {
            *(char *)local_c0 = (char)uVar44 << 4;
          }
          else {
            uVar11 = uVar44 - 0xf;
            *(char *)local_c0 = -0x10;
            psVar45 = (short *)((long)local_c0 + 1);
            if (0xfe < uVar11) {
              uVar46 = (uVar44 - 0x10e) / 0xff;
              memset((short *)((long)local_c0 + 1),0xff,uVar46 + 1);
              uVar11 = (uVar44 + uVar46 * -0xff) - 0x10e;
              psVar45 = (short *)((long)local_c0 + uVar46 + 2);
            }
            local_c0 = psVar45;
            *(char *)local_c0 = (char)uVar11;
          }
          memcpy((char *)((long)local_c0 + 1),local_b8,uVar44);
          local_c0 = (short *)((long)local_c0 + uVar44 + 1);
        }
        iVar38 = (int)local_c0;
        bVar47 = pcVar28 < pcVar42;
        bVar48 = pcVar28 == pcVar42;
      }
      if (bVar47 || bVar48) {
        return iVar38 - iVar5;
      }
      return 0;
    }
    if (sVar1 == 0) {
      if (*(short *)((long)state + 0x4006) != 0) {
        *(undefined2 *)((long)state + 0x4006) = 0;
        memset(state,0,0x4004);
      }
      if (*(int *)((long)state + 0x4000) != 0) {
        *(int *)((long)state + 0x4000) = *(int *)((long)state + 0x4000) + 0x10000;
      }
      *(undefined8 *)((long)state + 0x4008) = 0;
      *(undefined8 *)((long)state + 0x4010) = 0;
      *(undefined4 *)((long)state + 0x4018) = 0;
    }
    else {
      memset(state,0,0x4020);
    }
    if (0x7e000000 < (uint)srcSize) {
      return 0;
    }
    uVar43 = *(uint *)((long)state + 0x4000);
    uVar11 = (long)src - (ulong)uVar43;
    pcVar42 = dst + dstCapacity;
    *(int *)((long)state + 0x4018) = *(int *)((long)state + 0x4018) + srcSize;
    *(uint *)((long)state + 0x4000) = srcSize + uVar43;
    *(undefined2 *)((long)state + 0x4006) = 2;
    *(uint *)((long)state + ((ulong)(*(long *)src * -0x30e4432345000000) >> 0x34) * 4) = uVar43;
    plVar32 = (long *)(src + 1);
    uVar44 = (ulong)(*(long *)(src + 1) * -0x30e4432345000000) >> 0x34;
    piVar14 = (int *)src;
    do {
      iVar22 = 1;
      iVar13 = iVar38 << 6;
      while( true ) {
        plVar31 = (long *)((long)iVar22 + (long)plVar32);
        iVar22 = (int)plVar32;
        iVar21 = (int)uVar11;
        if (src + ((ulong)(uint)srcSize - 0xb) < plVar31) {
          iVar20 = 2;
        }
        else {
          uVar43 = *(uint *)((long)state + uVar44 * 4);
          piVar14 = (int *)(uVar43 + uVar11);
          uVar46 = (ulong)(*plVar31 * -0x30e4432345000000) >> 0x34;
          *(int *)((long)state + uVar44 * 4) = iVar22 - iVar21;
          iVar20 = 8;
          uVar44 = uVar46;
          if (((uint)(iVar22 - iVar21) <= uVar43 + 0xffff) &&
             (iVar20 = 7, *piVar14 != (int)*plVar32)) {
            iVar20 = 0;
          }
        }
        if ((iVar20 != 0) && (iVar20 != 8)) break;
        iVar22 = iVar13 >> 6;
        iVar13 = iVar13 + 1;
        plVar32 = plVar31;
      }
      if (iVar20 == 7) {
        iVar20 = 0;
      }
      plVar31 = (long *)dst;
      if (iVar20 == 0) {
        uVar29 = iVar22 - (int)local_b8;
        lVar27 = 0;
        cVar4 = (char)plVar32 * '\x10' + (char)local_b8 * -0x10;
        uVar43 = uVar29 - 0xf;
        do {
          uVar24 = uVar43;
          cVar37 = cVar4;
          lVar9 = lVar27;
          piVar40 = (int *)((long)piVar14 + lVar9);
          plVar7 = (long *)((long)plVar32 + lVar9);
          if ((piVar40 <= src) || (plVar7 <= local_b8)) break;
          lVar27 = lVar9 + -1;
          cVar4 = cVar37 + -0x10;
          uVar43 = uVar24 - 1;
        } while (*(char *)((long)plVar32 + lVar9 + -1) == *(char *)((long)piVar14 + lVar9 + -1));
        iVar13 = (int)lVar9;
        uVar46 = (ulong)(uint)(iVar13 + (iVar22 - (int)local_b8));
        plVar31 = (long *)((long)dst + 1);
        pcVar28 = (char *)((long)dst + ((ulong)uVar29 + lVar9 & 0xffffffff) / 0xff + uVar46 + 9);
        if (pcVar42 < pcVar28) {
          iVar20 = 1;
        }
        else {
          if ((uint)((ulong)uVar29 + lVar9) < 0xf) {
            *dst = cVar37;
            plVar32 = plVar31;
          }
          else {
            uVar6 = (ulong)(uVar29 - 0xf) + lVar9;
            *dst = -0x10;
            if (0xfe < (int)uVar6) {
              if (0x1fc < (int)uVar24) {
                uVar24 = 0x1fd;
              }
              uVar43 = (uVar29 - uVar24) + iVar13 + 0xef;
              uVar6 = (ulong)uVar43 / 0xff;
              memset(plVar31,0xff,(ulong)(uVar43 / 0xff + 1));
              plVar31 = (long *)((long)dst + uVar6 + 2);
              uVar6 = (ulong)((uVar29 - 0x10e) + iVar13 + (int)uVar6 * -0xff);
            }
            *(char *)plVar31 = (char)uVar6;
            plVar32 = (long *)((long)plVar31 + 1);
          }
          plVar31 = (long *)(uVar46 + (long)plVar32);
          plVar15 = local_b8;
          do {
            *plVar32 = *plVar15;
            plVar32 = plVar32 + 1;
            plVar15 = plVar15 + 1;
          } while (plVar32 < plVar31);
          iVar20 = 0;
        }
        plVar32 = plVar7;
        piVar14 = piVar40;
        if (pcVar28 <= pcVar42) {
          do {
            *(short *)plVar31 = (short)plVar7 - (short)piVar40;
            puVar26 = (ulong *)((long)plVar7 + 4);
            puVar25 = (ulong *)(piVar40 + 1);
            puVar19 = puVar26;
            uVar46 = uVar11;
            if (puVar26 < src + ((ulong)(uint)srcSize - 0xc)) {
              uVar6 = *(ulong *)((long)plVar7 + 4) ^ *(ulong *)(piVar40 + 1);
              uVar46 = 0;
              if (uVar6 != 0) {
                for (; (uVar6 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                }
              }
              uVar46 = uVar46 >> 3 & 0x1fffffff;
              uVar43 = (uint)uVar46;
              puVar19 = (ulong *)((long)plVar7 + 0xc);
              puVar25 = (ulong *)(piVar40 + 3);
              if (*(ulong *)(piVar40 + 1) == *(ulong *)((long)plVar7 + 4)) goto LAB_0010e87e;
            }
            else {
LAB_0010e87e:
              do {
                if (src + ((ulong)(uint)srcSize - 0xc) <= puVar19) {
                  if ((puVar19 < src + ((ulong)(uint)srcSize - 8)) &&
                     ((int)*puVar25 == (int)*puVar19)) {
                    puVar19 = (ulong *)((long)puVar19 + 4);
                    puVar25 = (ulong *)((long)puVar25 + 4);
                  }
                  if ((puVar19 < src + ((ulong)(uint)srcSize - 6)) &&
                     ((short)*puVar25 == (short)*puVar19)) {
                    puVar19 = (ulong *)((long)puVar19 + 2);
                    puVar25 = (ulong *)((long)puVar25 + 2);
                  }
                  if (puVar19 < src + ((ulong)(uint)srcSize - 5)) {
                    puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar25 == (char)*puVar19));
                  }
                  uVar43 = (int)puVar19 - (int)puVar26;
                  break;
                }
                uVar6 = *puVar25;
                uVar34 = *puVar19 ^ uVar6;
                uVar36 = 0;
                if (uVar34 != 0) {
                  for (; (uVar34 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                  }
                }
                puVar35 = (ulong *)((uVar36 >> 3 & 0x1fffffff) + (long)puVar19);
                puVar25 = puVar25 + 1;
                bVar47 = uVar6 == *puVar19;
                puVar19 = puVar19 + 1;
                if (!bVar47) {
                  puVar19 = puVar35;
                }
                uVar46 = uVar46 & 0xffffffff;
                if (!bVar47) {
                  uVar46 = (ulong)(uint)((int)puVar35 - (int)puVar26);
                }
                uVar43 = (uint)uVar46;
              } while (bVar47);
            }
            plVar15 = (long *)((long)plVar31 + 2);
            pcVar28 = (char *)((long)plVar31 + (ulong)(uVar43 + 0xf0) / 0xff + 8);
            if (pcVar28 <= pcVar42) {
              if (uVar43 < 0xf) {
                *dst = (char)*(long *)dst + (char)uVar43;
              }
              else {
                *dst = (char)*(long *)dst + '\x0f';
                uVar29 = uVar43 - 0xf;
                *(undefined4 *)plVar15 = 0xffffffff;
                if (0x3fb < uVar29) {
                  uVar24 = uVar43 - 0x40b;
                  memset((char *)((long)plVar31 + 6),0xff,(ulong)((uVar24 / 0x3fc) * 4 + 4));
                  uVar29 = uVar24 % 0x3fc;
                  plVar15 = (long *)((long)plVar31 + (ulong)((uVar24 / 0x3fc) * 4) + 6);
                }
                pcVar18 = (char *)((long)plVar15 + (ulong)uVar29 / 0xff);
                plVar15 = (long *)(pcVar18 + 1);
                *pcVar18 = (char)(uVar29 / 0xff) + (char)uVar29;
              }
            }
            lVar27 = (ulong)uVar43 + (long)plVar7;
            plVar7 = (long *)(lVar27 + 4);
            plVar32 = plVar7;
            plVar31 = plVar15;
            piVar14 = piVar40;
            if (pcVar42 < pcVar28) {
              iVar20 = 1;
              goto LAB_0010ead0;
            }
            local_b8 = plVar7;
            if (src + ((ulong)(uint)srcSize - 0xb) <= plVar7) {
              iVar20 = 3;
              goto LAB_0010ead0;
            }
            *(int *)((long)state +
                    ((ulong)(*(long *)(lVar27 + 2) * -0x30e4432345000000) >> 0x34) * 4) =
                 ((int)lVar27 + 2) - iVar21;
            uVar46 = (ulong)(*plVar7 * -0x30e4432345000000) >> 0x34;
            uVar29 = (int)plVar7 - iVar21;
            uVar43 = *(uint *)((long)state + uVar46 * 4);
            piVar40 = (int *)(uVar43 + uVar11);
            *(uint *)((long)state + uVar46 * 4) = uVar29;
            bVar47 = true;
            if ((uVar29 <= uVar43 + 0xffff) && (*piVar40 == *(int *)plVar7)) {
              *(char *)plVar15 = '\0';
              bVar47 = false;
              dst = (char *)plVar15;
              plVar15 = (long *)((long)plVar15 + 1);
            }
            plVar31 = plVar15;
          } while (!bVar47);
          uVar44 = (ulong)(*(long *)(lVar27 + 5) * -0x30e4432345000000) >> 0x34;
          iVar20 = 0;
          plVar32 = (long *)(lVar27 + 5);
          piVar14 = piVar40;
        }
      }
LAB_0010ead0:
      dst = (char *)plVar31;
      if (iVar20 != 0) {
        if (1 < iVar20 - 2U) {
          return 0;
        }
        pcVar18 = src + ((ulong)(uint)srcSize - (long)local_b8);
        pcVar28 = (char *)((long)plVar31 + (long)(pcVar18 + (ulong)(pcVar18 + 0xf0) / 0xff + 1));
        if (pcVar28 <= pcVar42) {
          if (pcVar18 < (char *)0xf) {
            *(char *)plVar31 = (char)pcVar18 << 4;
          }
          else {
            pcVar12 = pcVar18 + -0xf;
            *(char *)plVar31 = -0x10;
            plVar32 = (long *)((long)plVar31 + 1);
            if ((char *)0xfe < pcVar12) {
              uVar44 = (ulong)(pcVar18 + -0x10e) / 0xff;
              memset(plVar32,0xff,uVar44 + 1);
              plVar32 = (long *)((long)plVar31 + uVar44 + 2);
              pcVar12 = pcVar18 + uVar44 * -0xff + -0x10e;
            }
            *(char *)plVar32 = (char)pcVar12;
            plVar31 = plVar32;
          }
          memcpy((char *)((long)plVar31 + 1),local_b8,(size_t)pcVar18);
          plVar31 = (long *)((long)plVar31 + (long)(pcVar18 + 1));
        }
        if (pcVar42 < pcVar28) {
          return 0;
        }
        return (int)plVar31 - iVar5;
      }
    } while( true );
  }
  if (srcSize < 0x1000b) {
    if (sVar1 == 0) {
      if ((*(short *)((long)state + 0x4006) != 0) &&
         (((*(short *)((long)state + 0x4006) != 3 || (0xfff < srcSize)) ||
          (0xfffe < (uint)(*(int *)((long)state + 0x4000) + srcSize))))) {
        *(undefined2 *)((long)state + 0x4006) = 0;
        memset(state,0,0x4004);
      }
      *(undefined8 *)((long)state + 0x4008) = 0;
      *(undefined8 *)((long)state + 0x4010) = 0;
      *(undefined4 *)((long)state + 0x4018) = 0;
    }
    else {
      memset(state,0,0x4020);
    }
    uVar43 = *(uint *)((long)state + 0x4000);
    if ((ulong)uVar43 != 0) {
      if (0x7e000000 < (uint)srcSize) {
        return 0;
      }
      iVar13 = *(int *)((long)state + 0x4018);
      *(int *)((long)state + 0x4018) = iVar13 + srcSize;
      *(uint *)((long)state + 0x4000) = uVar43 + srcSize;
      *(undefined2 *)((long)state + 0x4006) = 3;
      piVar40 = (int *)src;
      if (0xc < srcSize) {
        lVar27 = (long)src - (ulong)uVar43;
        uVar29 = uVar43 - iVar13;
        *(short *)((long)state + (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2) =
             (short)uVar43;
        piVar16 = (int *)(src + 1);
        uVar43 = (uint)(*(int *)(src + 1) * -0x61c8864f) >> 0x13;
        do {
          iVar22 = 1;
          iVar13 = iVar38 << 6;
          while( true ) {
            piVar33 = (int *)((long)iVar22 + (long)piVar16);
            sVar1 = (short)lVar27;
            if (src + (long)srcSize + -0xb < piVar33) {
              iVar22 = 2;
            }
            else {
              uVar44 = (ulong)uVar43;
              uVar2 = *(ushort *)((long)state + uVar44 * 2);
              piVar14 = (int *)((ulong)uVar2 + lVar27);
              uVar43 = (uint)(*piVar33 * -0x61c8864f) >> 0x13;
              *(short *)((long)state + uVar44 * 2) = (short)piVar16 - sVar1;
              iVar22 = 8;
              if ((uVar29 <= uVar2) && (iVar22 = 7, *piVar14 != *piVar16)) {
                iVar22 = 0;
              }
            }
            if ((iVar22 != 0) && (iVar22 != 8)) break;
            iVar22 = iVar13 >> 6;
            iVar13 = iVar13 + 1;
            piVar16 = piVar33;
          }
          if (iVar22 == 7) {
            iVar22 = 0;
          }
          if (iVar22 == 0) {
            iVar13 = (int)piVar16 - (int)piVar40;
            lVar9 = 0;
            uVar24 = iVar13 - 0xfU;
            cVar4 = (char)piVar16 * '\x10' + (char)piVar40 * -0x10;
            do {
              cVar37 = cVar4;
              uVar23 = uVar24;
              lVar39 = lVar9;
              piVar33 = (int *)((long)piVar14 + lVar39);
              piVar10 = (int *)((long)piVar16 + lVar39);
              if ((piVar33 <= src) || (piVar10 <= piVar40)) break;
              lVar9 = lVar39 + -1;
              uVar24 = uVar23 - 1;
              cVar4 = cVar37 + -0x10;
            } while (*(char *)((long)piVar16 + lVar39 + -1) ==
                     *(char *)((long)piVar14 + lVar39 + -1));
            iVar22 = (int)lVar39;
            psVar45 = (short *)((long)dst + 1);
            if ((uint)(iVar13 + iVar22) < 0xf) {
              *dst = cVar37;
            }
            else {
              uVar44 = (ulong)(iVar13 - 0xfU) + lVar39;
              *dst = -0x10;
              if (0xfe < (int)uVar44) {
                if (0x1fc < (int)uVar23) {
                  uVar23 = 0x1fd;
                }
                uVar24 = (iVar13 - uVar23) + iVar22 + 0xef;
                uVar44 = (ulong)uVar24 / 0xff;
                memset(psVar45,0xff,(ulong)(uVar24 / 0xff + 1));
                psVar45 = (short *)((long)dst + uVar44 + 2);
                uVar44 = (ulong)(uint)(iVar13 + -0x10e + iVar22 + (int)uVar44 * -0xff);
              }
              *(char *)psVar45 = (char)uVar44;
              psVar45 = (short *)((long)psVar45 + 1);
            }
            psVar30 = (short *)((ulong)(uint)((int)piVar10 - (int)piVar40) + (long)psVar45);
            do {
              *(undefined8 *)psVar45 = *(undefined8 *)piVar40;
              psVar45 = psVar45 + 4;
              piVar40 = piVar40 + 2;
              piVar14 = piVar33;
              psVar17 = (short *)dst;
            } while (psVar45 < psVar30);
            do {
              *psVar30 = (short)piVar10 - (short)piVar14;
              puVar26 = (ulong *)(piVar10 + 1);
              puVar25 = (ulong *)(piVar14 + 1);
              puVar19 = puVar26;
              if (puVar26 < src + (long)srcSize + -0xc) {
                uVar11 = *(ulong *)(piVar10 + 1) ^ *(ulong *)(piVar14 + 1);
                uVar44 = 0;
                if (uVar11 != 0) {
                  for (; (uVar11 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                  }
                }
                uVar44 = uVar44 >> 3 & 0x1fffffff;
                puVar19 = (ulong *)(piVar10 + 3);
                puVar25 = (ulong *)(piVar14 + 3);
                if (*(ulong *)(piVar14 + 1) == *(ulong *)(piVar10 + 1)) goto LAB_0010ff01;
              }
              else {
LAB_0010ff01:
                do {
                  if (src + (long)srcSize + -0xc <= puVar19) {
                    if ((puVar19 < src + (long)srcSize + -8) && ((int)*puVar25 == (int)*puVar19)) {
                      puVar19 = (ulong *)((long)puVar19 + 4);
                      puVar25 = (ulong *)((long)puVar25 + 4);
                    }
                    if ((puVar19 < src + (long)srcSize + -6) && ((short)*puVar25 == (short)*puVar19)
                       ) {
                      puVar19 = (ulong *)((long)puVar19 + 2);
                      puVar25 = (ulong *)((long)puVar25 + 2);
                    }
                    if (puVar19 < src + (long)srcSize + -5) {
                      puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar25 == (char)*puVar19))
                      ;
                    }
                    uVar44 = (ulong)(uint)((int)puVar19 - (int)puVar26);
                    goto LAB_0010ff3c;
                  }
                  uVar44 = *puVar25;
                  uVar11 = *puVar19;
                  uVar6 = uVar11 ^ uVar44;
                  uVar46 = 0;
                  if (uVar6 != 0) {
                    for (; (uVar6 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                    }
                  }
                  iVar13 = (int)puVar19;
                  puVar25 = puVar25 + 1;
                  puVar19 = puVar19 + 1;
                } while (uVar44 == uVar11);
                uVar44 = (ulong)((((uint)(uVar46 >> 3) & 0x1fffffff) + iVar13) - (int)puVar26);
              }
LAB_0010ff3c:
              dst = (char *)(psVar30 + 1);
              uVar24 = (uint)uVar44;
              if (uVar24 < 0xf) {
                *(char *)psVar17 = (char)*psVar17 + (char)uVar44;
              }
              else {
                *(char *)psVar17 = (char)*psVar17 + '\x0f';
                uVar23 = uVar24 - 0xf;
                *(short *)((long)dst + 0) = -1;
                *(short *)((long)dst + 2) = -1;
                if (0x3fb < uVar23) {
                  uVar24 = uVar24 - 0x40b;
                  memset(psVar30 + 3,0xff,(ulong)((uVar24 / 0x3fc) * 4 + 4));
                  uVar23 = uVar24 % 0x3fc;
                  dst = (char *)((long)psVar30 + (ulong)((uVar24 / 0x3fc) * 4) + 6);
                }
                pcVar42 = (char *)((long)dst + (ulong)uVar23 / 0xff);
                dst = pcVar42 + 1;
                *pcVar42 = (char)(uVar23 / 0xff) + (char)uVar23;
              }
              lVar9 = (long)piVar10 + uVar44;
              piVar10 = (int *)(lVar9 + 4);
              piVar40 = piVar10;
              if (src + (long)srcSize + -0xb <= piVar10) {
                iVar22 = 3;
                piVar16 = piVar10;
                goto LAB_00110100;
              }
              *(short *)((long)state +
                        (ulong)((uint)(*(int *)(lVar9 + 2) * -0x61c8864f) >> 0x13) * 2) =
                   ((short)lVar9 + 2) - sVar1;
              uVar44 = (ulong)((uint)(*piVar10 * -0x61c8864f) >> 0x13);
              uVar2 = *(ushort *)((long)state + uVar44 * 2);
              piVar14 = (int *)((ulong)uVar2 + lVar27);
              *(short *)((long)state + uVar44 * 2) = (short)piVar10 - sVar1;
              bVar47 = true;
              psVar30 = (short *)dst;
              if ((uVar29 <= uVar2) && (*piVar14 == *piVar10)) {
                *dst = '\0';
                bVar47 = false;
                psVar30 = (short *)((long)dst + 1);
                psVar17 = (short *)dst;
              }
            } while (!bVar47);
            uVar43 = (uint)(*(int *)(lVar9 + 5) * -0x61c8864f) >> 0x13;
            iVar22 = 0;
            piVar16 = (int *)(lVar9 + 5);
            dst = (char *)psVar30;
          }
LAB_00110100:
        } while (iVar22 == 0);
        if (1 < iVar22 - 2U) {
          return 0;
        }
      }
      pcVar42 = src + ((long)srcSize - (long)piVar40);
      if (pcVar42 < (char *)0xf) {
        *dst = (char)pcVar42 << 4;
      }
      else {
        pcVar28 = pcVar42 + -0xf;
        *dst = -0x10;
        psVar45 = (short *)((long)dst + 1);
        if ((char *)0xfe < pcVar28) {
          uVar44 = (ulong)(pcVar42 + -0x10e) / 0xff;
          memset(psVar45,0xff,uVar44 + 1);
          psVar45 = (short *)((long)dst + uVar44 + 2);
          pcVar28 = pcVar42 + uVar44 * -0xff + -0x10e;
        }
        *(char *)psVar45 = (char)pcVar28;
        dst = (char *)psVar45;
      }
      memcpy((char *)((long)dst + 1),piVar40,(size_t)pcVar42);
      iVar38 = (int)(char *)((long)dst + 1) + (int)pcVar42;
      goto LAB_0011081a;
    }
    if (0x7e000000 < (uint)srcSize) {
      return 0;
    }
    *(int *)((long)state + 0x4018) = *(int *)((long)state + 0x4018) + srcSize;
    pcVar42 = src + srcSize;
    *(int *)((long)state + 0x4000) = srcSize;
    *(undefined2 *)((long)state + 0x4006) = 3;
    if (0xc < srcSize) {
      *(undefined2 *)((long)state + (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2) = 0;
      piVar14 = (int *)(src + 1);
      uVar44 = (ulong)((uint)(*(int *)(src + 1) * -0x61c8864f) >> 0x13);
      pcVar28 = pcVar42;
      piVar40 = (int *)src;
      do {
        iVar22 = 1;
        piVar16 = piVar14;
        iVar13 = iVar38 << 6;
        do {
          piVar14 = piVar16;
          piVar16 = (int *)((long)iVar22 + (long)piVar14);
          if (src + (long)srcSize + -0xb < piVar16) {
            iVar21 = 2;
          }
          else {
            uVar2 = *(ushort *)((long)state + uVar44 * 2);
            iVar22 = *piVar16;
            *(short *)((long)state + uVar44 * 2) = (short)piVar14 - sVar3;
            iVar21 = 7;
            if (*(int *)(src + uVar2) != *piVar14) {
              iVar21 = 0;
            }
            pcVar28 = src + uVar2;
            uVar44 = (ulong)((uint)(iVar22 * -0x61c8864f) >> 0x13);
          }
          iVar22 = iVar13 >> 6;
          iVar13 = iVar13 + 1;
        } while (iVar21 == 0);
        if (iVar21 == 7) {
          iVar21 = 0;
        }
        if (iVar21 == 0) {
          iVar13 = (int)piVar14 - (int)piVar40;
          lVar27 = 0;
          cVar4 = (char)piVar14 * '\x10' + (char)piVar40 * -0x10;
          uVar43 = iVar13 - 0xfU;
          do {
            uVar29 = uVar43;
            cVar37 = cVar4;
            lVar9 = lVar27;
            pcVar18 = pcVar28 + lVar9;
            piVar16 = (int *)((long)piVar14 + lVar9);
            if ((pcVar18 <= src) || (piVar16 <= piVar40)) break;
            lVar27 = lVar9 + -1;
            cVar4 = cVar37 + -0x10;
            uVar43 = uVar29 - 1;
          } while (*(char *)((long)piVar14 + lVar9 + -1) == pcVar28[lVar9 + -1]);
          iVar22 = (int)lVar9;
          psVar45 = (short *)((long)dst + 1);
          if ((uint)(iVar13 + iVar22) < 0xf) {
            *dst = cVar37;
          }
          else {
            uVar11 = (ulong)(iVar13 - 0xfU) + lVar9;
            *dst = -0x10;
            if (0xfe < (int)uVar11) {
              if (0x1fc < (int)uVar29) {
                uVar29 = 0x1fd;
              }
              uVar43 = (iVar13 - uVar29) + iVar22 + 0xef;
              memset(psVar45,0xff,(ulong)(uVar43 / 0xff + 1));
              psVar45 = (short *)((long)dst + (ulong)uVar43 / 0xff + 2);
              uVar11 = (ulong)(iVar13 + -0x10e + iVar22 + uVar43 / 0xff);
            }
            *(char *)psVar45 = (char)uVar11;
            psVar45 = (short *)((long)psVar45 + 1);
          }
          psVar30 = (short *)((ulong)(uint)((int)piVar16 - (int)piVar40) + (long)psVar45);
          do {
            *(undefined8 *)psVar45 = *(undefined8 *)piVar40;
            psVar45 = psVar45 + 4;
            piVar40 = piVar40 + 2;
            psVar17 = (short *)dst;
          } while (psVar45 < psVar30);
          do {
            *psVar30 = (short)piVar16 - (short)pcVar18;
            puVar25 = (ulong *)(piVar16 + 1);
            puVar19 = (ulong *)(pcVar18 + 4);
            puVar26 = puVar25;
            if (puVar25 < pcVar42 + -0xc) {
              uVar46 = *(ulong *)(piVar16 + 1) ^ *(ulong *)(pcVar18 + 4);
              uVar11 = 0;
              if (uVar46 != 0) {
                for (; (uVar46 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                }
              }
              uVar11 = uVar11 >> 3 & 0x1fffffff;
              puVar26 = (ulong *)(piVar16 + 3);
              puVar19 = (ulong *)(pcVar18 + 0xc);
              if (*(ulong *)(pcVar18 + 4) == *(ulong *)(piVar16 + 1)) goto LAB_0011053f;
            }
            else {
LAB_0011053f:
              do {
                if (pcVar42 + -0xc <= puVar26) {
                  if ((puVar26 < pcVar42 + -8) && ((int)*puVar19 == (int)*puVar26)) {
                    puVar26 = (ulong *)((long)puVar26 + 4);
                    puVar19 = (ulong *)((long)puVar19 + 4);
                  }
                  if ((puVar26 < pcVar42 + -6) && ((short)*puVar19 == (short)*puVar26)) {
                    puVar26 = (ulong *)((long)puVar26 + 2);
                    puVar19 = (ulong *)((long)puVar19 + 2);
                  }
                  if (puVar26 < src + (long)srcSize + -5) {
                    puVar26 = (ulong *)((long)puVar26 + (ulong)((char)*puVar19 == (char)*puVar26));
                  }
                  uVar11 = (ulong)(uint)((int)puVar26 - (int)puVar25);
                  goto LAB_0011057a;
                }
                uVar11 = *puVar19;
                uVar46 = *puVar26;
                uVar36 = uVar46 ^ uVar11;
                uVar6 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                  }
                }
                iVar13 = (int)puVar26;
                puVar19 = puVar19 + 1;
                puVar26 = puVar26 + 1;
              } while (uVar11 == uVar46);
              uVar11 = (ulong)((((uint)(uVar6 >> 3) & 0x1fffffff) + iVar13) - (int)puVar25);
            }
LAB_0011057a:
            dst = (char *)(psVar30 + 1);
            uVar43 = (uint)uVar11;
            if (uVar43 < 0xf) {
              *(char *)psVar17 = (char)*psVar17 + (char)uVar11;
            }
            else {
              *(char *)psVar17 = (char)*psVar17 + '\x0f';
              uVar29 = uVar43 - 0xf;
              *(short *)((long)dst + 0) = -1;
              *(short *)((long)dst + 2) = -1;
              if (0x3fb < uVar29) {
                uVar43 = uVar43 - 0x40b;
                memset(psVar30 + 3,0xff,(ulong)((uVar43 / 0x3fc) * 4 + 4));
                uVar29 = uVar43 % 0x3fc;
                dst = (char *)((long)psVar30 + (ulong)((uVar43 / 0x3fc) * 4) + 6);
              }
              pcVar28 = (char *)((long)dst + (ulong)uVar29 / 0xff);
              dst = pcVar28 + 1;
              *pcVar28 = (char)(uVar29 / 0xff) + (char)uVar29;
            }
            lVar27 = (long)piVar16 + uVar11;
            piVar40 = (int *)(lVar27 + 4);
            if (src + (long)srcSize + -0xb <= piVar40) {
              iVar21 = 3;
              pcVar28 = pcVar18;
              piVar14 = piVar40;
              goto LAB_001106c5;
            }
            *(short *)((long)state + (ulong)((uint)(*(int *)(lVar27 + 2) * -0x61c8864f) >> 0x13) * 2
                      ) = ((short)lVar27 + 2) - sVar3;
            uVar11 = (ulong)((uint)(*piVar40 * -0x61c8864f) >> 0x13);
            uVar2 = *(ushort *)((long)state + uVar11 * 2);
            *(short *)((long)state + uVar11 * 2) = (short)piVar40 - sVar3;
            iVar13 = *(int *)(src + uVar2);
            iVar22 = *piVar40;
            psVar30 = (short *)dst;
            if (iVar13 == iVar22) {
              *dst = '\0';
              psVar30 = (short *)((long)dst + 1);
              psVar17 = (short *)dst;
            }
            pcVar18 = src + uVar2;
            piVar16 = piVar40;
          } while (iVar13 == iVar22);
          uVar44 = (ulong)((uint)(*(int *)(lVar27 + 5) * -0x61c8864f) >> 0x13);
          iVar21 = 0;
          dst = (char *)psVar30;
          pcVar28 = pcVar18;
          piVar14 = (int *)(lVar27 + 5);
        }
LAB_001106c5:
      } while (iVar21 == 0);
      src = (char *)piVar40;
      if (1 < iVar21 - 2U) {
        return 0;
      }
    }
    pcVar42 = pcVar42 + -(long)src;
    if (pcVar42 < (char *)0xf) {
      *dst = (char)pcVar42 << 4;
    }
    else {
      pcVar28 = pcVar42 + -0xf;
      *dst = -0x10;
      psVar45 = (short *)((long)dst + 1);
      if ((char *)0xfe < pcVar28) {
        uVar44 = (ulong)(pcVar42 + -0x10e) / 0xff;
        memset(psVar45,0xff,uVar44 + 1);
        psVar45 = (short *)((long)dst + uVar44 + 2);
        pcVar28 = pcVar42 + uVar44 * -0xff + -0x10e;
      }
      *(char *)psVar45 = (char)pcVar28;
      dst = (char *)psVar45;
    }
    memcpy((char *)((long)dst + 1),src,(size_t)pcVar42);
    iVar38 = (int)(char *)((long)dst + 1);
  }
  else {
    if (sVar1 == 0) {
      if (*(short *)((long)state + 0x4006) != 0) {
        *(undefined2 *)((long)state + 0x4006) = 0;
        memset(state,0,0x4004);
      }
      if (*(int *)((long)state + 0x4000) != 0) {
        *(int *)((long)state + 0x4000) = *(int *)((long)state + 0x4000) + 0x10000;
      }
      *(undefined8 *)((long)state + 0x4008) = 0;
      *(undefined8 *)((long)state + 0x4010) = 0;
      *(undefined4 *)((long)state + 0x4018) = 0;
    }
    else {
      memset(state,0,0x4020);
    }
    if (0x7e000000 < (uint)srcSize) {
      return 0;
    }
    uVar43 = *(uint *)((long)state + 0x4000);
    lVar27 = (long)src - (ulong)uVar43;
    *(int *)((long)state + 0x4018) = *(int *)((long)state + 0x4018) + srcSize;
    *(uint *)((long)state + 0x4000) = srcSize + uVar43;
    *(undefined2 *)((long)state + 0x4006) = 2;
    *(uint *)((long)state + ((ulong)(*(long *)src * -0x30e4432345000000) >> 0x34) * 4) = uVar43;
    plVar32 = (long *)(src + 1);
    uVar44 = (ulong)(*(long *)(src + 1) * -0x30e4432345000000) >> 0x34;
    plVar31 = (long *)src;
    do {
      iVar22 = 1;
      iVar13 = iVar38 << 6;
      while( true ) {
        plVar7 = (long *)((long)iVar22 + (long)plVar32);
        iVar22 = (int)lVar27;
        if (src + ((ulong)(uint)srcSize - 0xb) < plVar7) {
          iVar21 = 2;
        }
        else {
          uVar43 = *(uint *)((long)state + uVar44 * 4);
          uVar29 = (int)plVar32 - iVar22;
          piVar14 = (int *)((ulong)uVar43 + lVar27);
          uVar11 = (ulong)(*plVar7 * -0x30e4432345000000) >> 0x34;
          *(uint *)((long)state + uVar44 * 4) = uVar29;
          iVar21 = 8;
          uVar44 = uVar11;
          if ((uVar29 <= uVar43 + 0xffff) && (iVar21 = 7, *piVar14 != (int)*plVar32)) {
            iVar21 = 0;
          }
        }
        if ((iVar21 != 0) && (iVar21 != 8)) break;
        iVar22 = iVar13 >> 6;
        iVar13 = iVar13 + 1;
        plVar32 = plVar7;
      }
      if (iVar21 == 7) {
        iVar21 = 0;
      }
      if (iVar21 == 0) {
        iVar13 = (int)plVar32 - (int)plVar31;
        lVar9 = 0;
        uVar43 = iVar13 - 0xfU;
        cVar4 = (char)plVar32 * '\x10' + (char)plVar31 * -0x10;
        do {
          cVar37 = cVar4;
          uVar29 = uVar43;
          lVar39 = lVar9;
          piVar40 = (int *)((long)piVar14 + lVar39);
          plVar7 = (long *)((long)plVar32 + lVar39);
          if ((piVar40 <= src) || (plVar7 <= plVar31)) break;
          lVar9 = lVar39 + -1;
          uVar43 = uVar29 - 1;
          cVar4 = cVar37 + -0x10;
        } while (*(char *)((long)plVar32 + lVar39 + -1) == *(char *)((long)piVar14 + lVar39 + -1));
        iVar21 = (int)lVar39;
        plVar32 = (long *)((long)dst + 1);
        if ((uint)(iVar13 + iVar21) < 0xf) {
          *dst = cVar37;
        }
        else {
          uVar11 = (ulong)(iVar13 - 0xfU) + lVar39;
          *dst = -0x10;
          if (0xfe < (int)uVar11) {
            if (0x1fc < (int)uVar29) {
              uVar29 = 0x1fd;
            }
            uVar43 = (iVar13 - uVar29) + iVar21 + 0xef;
            uVar11 = (ulong)uVar43 / 0xff;
            memset(plVar32,0xff,(ulong)(uVar43 / 0xff + 1));
            plVar32 = (long *)((long)dst + uVar11 + 2);
            uVar11 = (ulong)(uint)(iVar13 + -0x10e + iVar21 + (int)uVar11 * -0xff);
          }
          *(char *)plVar32 = (char)uVar11;
          plVar32 = (long *)((long)plVar32 + 1);
        }
        plVar15 = (long *)((ulong)(uint)((int)plVar7 - (int)plVar31) + (long)plVar32);
        do {
          *plVar32 = *plVar31;
          plVar32 = plVar32 + 1;
          plVar31 = plVar31 + 1;
          piVar14 = piVar40;
        } while (plVar32 < plVar15);
        do {
          *(short *)plVar15 = (short)plVar7 - (short)piVar14;
          puVar26 = (ulong *)((long)plVar7 + 4);
          puVar25 = (ulong *)(piVar14 + 1);
          puVar19 = puVar26;
          if (puVar26 < src + ((ulong)(uint)srcSize - 0xc)) {
            uVar46 = *(ulong *)((long)plVar7 + 4) ^ *(ulong *)(piVar14 + 1);
            uVar11 = 0;
            if (uVar46 != 0) {
              for (; (uVar46 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
              }
            }
            uVar11 = uVar11 >> 3 & 0x1fffffff;
            puVar19 = (ulong *)((long)plVar7 + 0xc);
            puVar25 = (ulong *)(piVar14 + 3);
            if (*(ulong *)(piVar14 + 1) == *(ulong *)((long)plVar7 + 4)) goto LAB_0010ef0c;
          }
          else {
LAB_0010ef0c:
            do {
              if (src + ((ulong)(uint)srcSize - 0xc) <= puVar19) {
                if ((puVar19 < src + ((ulong)(uint)srcSize - 8)) && ((int)*puVar25 == (int)*puVar19)
                   ) {
                  puVar19 = (ulong *)((long)puVar19 + 4);
                  puVar25 = (ulong *)((long)puVar25 + 4);
                }
                if ((puVar19 < src + ((ulong)(uint)srcSize - 6)) &&
                   ((short)*puVar25 == (short)*puVar19)) {
                  puVar19 = (ulong *)((long)puVar19 + 2);
                  puVar25 = (ulong *)((long)puVar25 + 2);
                }
                if (puVar19 < src + ((ulong)(uint)srcSize - 5)) {
                  puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar25 == (char)*puVar19));
                }
                uVar11 = (ulong)(uint)((int)puVar19 - (int)puVar26);
                goto LAB_0010ef47;
              }
              uVar11 = *puVar25;
              uVar46 = *puVar19;
              uVar36 = uVar46 ^ uVar11;
              uVar6 = 0;
              if (uVar36 != 0) {
                for (; (uVar36 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                }
              }
              iVar13 = (int)puVar19;
              puVar25 = puVar25 + 1;
              puVar19 = puVar19 + 1;
            } while (uVar11 == uVar46);
            uVar11 = (ulong)((((uint)(uVar6 >> 3) & 0x1fffffff) + iVar13) - (int)puVar26);
          }
LAB_0010ef47:
          plVar8 = (long *)((long)plVar15 + 2);
          uVar43 = (uint)uVar11;
          if (uVar43 < 0xf) {
            *dst = (char)*(long *)dst + (char)uVar11;
          }
          else {
            *dst = (char)*(long *)dst + '\x0f';
            uVar29 = uVar43 - 0xf;
            *(undefined4 *)plVar8 = 0xffffffff;
            if (0x3fb < uVar29) {
              uVar43 = uVar43 - 0x40b;
              memset((char *)((long)plVar15 + 6),0xff,(ulong)((uVar43 / 0x3fc) * 4 + 4));
              uVar29 = uVar43 % 0x3fc;
              plVar8 = (long *)((long)plVar15 + (ulong)((uVar43 / 0x3fc) * 4) + 6);
            }
            pcVar42 = (char *)((long)plVar8 + (ulong)uVar29 / 0xff);
            plVar8 = (long *)(pcVar42 + 1);
            *pcVar42 = (char)(uVar29 / 0xff) + (char)uVar29;
          }
          lVar9 = (long)plVar7 + uVar11;
          plVar7 = (long *)(lVar9 + 4);
          plVar31 = plVar7;
          if (src + ((ulong)(uint)srcSize - 0xb) <= plVar7) {
            iVar21 = 3;
            plVar32 = plVar7;
            dst = (char *)plVar8;
            goto LAB_0010f0bc;
          }
          *(int *)((long)state + ((ulong)(*(long *)(lVar9 + 2) * -0x30e4432345000000) >> 0x34) * 4)
               = ((int)lVar9 + 2) - iVar22;
          uVar11 = (ulong)(*plVar7 * -0x30e4432345000000) >> 0x34;
          uVar29 = (int)plVar7 - iVar22;
          uVar43 = *(uint *)((long)state + uVar11 * 4);
          piVar14 = (int *)((ulong)uVar43 + lVar27);
          *(uint *)((long)state + uVar11 * 4) = uVar29;
          bVar47 = true;
          plVar15 = plVar8;
          if ((uVar29 <= uVar43 + 0xffff) && (*piVar14 == *(int *)plVar7)) {
            *(char *)plVar8 = '\0';
            bVar47 = false;
            plVar15 = (long *)((long)plVar8 + 1);
            dst = (char *)plVar8;
          }
        } while (!bVar47);
        uVar44 = (ulong)(*(long *)(lVar9 + 5) * -0x30e4432345000000) >> 0x34;
        iVar21 = 0;
        plVar32 = (long *)(lVar9 + 5);
        dst = (char *)plVar15;
      }
LAB_0010f0bc:
    } while (iVar21 == 0);
    if (1 < iVar21 - 2U) {
      return 0;
    }
    pcVar42 = src + ((ulong)(uint)srcSize - (long)plVar31);
    if (pcVar42 < (char *)0xf) {
      *dst = (char)pcVar42 << 4;
    }
    else {
      pcVar28 = pcVar42 + -0xf;
      *dst = -0x10;
      plVar32 = (long *)((long)dst + 1);
      if ((char *)0xfe < pcVar28) {
        uVar44 = (ulong)(pcVar42 + -0x10e) / 0xff;
        memset(plVar32,0xff,uVar44 + 1);
        plVar32 = (long *)((long)dst + uVar44 + 2);
        pcVar28 = pcVar42 + uVar44 * -0xff + -0x10e;
      }
      *(char *)plVar32 = (char)pcVar28;
      dst = (char *)plVar32;
    }
    memcpy((char *)((long)dst + 1),plVar31,(size_t)pcVar42);
    iVar38 = (int)(char *)((long)dst + 1);
  }
  iVar38 = iVar38 + (int)pcVar42;
LAB_0011081a:
  return iVar38 - iVar5;
}

Assistant:

int LZ4_compress_fast_extState_fastReset(void* state, const char* src, char* dst, int srcSize, int dstCapacity, int acceleration)
{
    LZ4_stream_t_internal* ctx = &((LZ4_stream_t*)state)->internal_donotuse;
    if (acceleration < 1) acceleration = ACCELERATION_DEFAULT;

    if (dstCapacity >= LZ4_compressBound(srcSize)) {
        if (srcSize < LZ4_64Klimit) {
            const tableType_t tableType = byU16;
            LZ4_prepareTable(ctx, srcSize, tableType);
            if (ctx->currentOffset) {
                return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, 0, notLimited, tableType, noDict, dictSmall, acceleration);
            } else {
                return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, 0, notLimited, tableType, noDict, noDictIssue, acceleration);
            }
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)src > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            LZ4_prepareTable(ctx, srcSize, tableType);
            return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, 0, notLimited, tableType, noDict, noDictIssue, acceleration);
        }
    } else {
        if (srcSize < LZ4_64Klimit) {
            const tableType_t tableType = byU16;
            LZ4_prepareTable(ctx, srcSize, tableType);
            if (ctx->currentOffset) {
                return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, dstCapacity, limitedOutput, tableType, noDict, dictSmall, acceleration);
            } else {
                return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, dstCapacity, limitedOutput, tableType, noDict, noDictIssue, acceleration);
            }
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)src > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            LZ4_prepareTable(ctx, srcSize, tableType);
            return LZ4_compress_generic(ctx, src, dst, srcSize, NULL, dstCapacity, limitedOutput, tableType, noDict, noDictIssue, acceleration);
        }
    }
}